

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vc1Parser.h
# Opt level: O3

int64_t __thiscall VC1Unit::vc1_unescape_buffer(VC1Unit *this,uint8_t *src,int64_t size)

{
  byte *pbVar1;
  uint8_t *__dest;
  size_t sVar2;
  long lVar3;
  long __n2;
  
  if (this->m_nalBuffer != (uint8_t *)0x0) {
    operator_delete__(this->m_nalBuffer);
  }
  __dest = (uint8_t *)operator_new__(size);
  this->m_nalBuffer = __dest;
  if (size < 4) {
    sVar2 = size;
    if (0 < size) {
      memcpy(__dest,src,size);
    }
  }
  else {
    lVar3 = 0;
    sVar2 = 0;
    do {
      if ((((lVar3 < 2) || (*src != '\x03')) || (src[-1] != '\0')) ||
         ((size + -1 <= lVar3 || src[-2] != '\0' || (pbVar1 = src + 1, 3 < *pbVar1)))) {
        this->m_nalBuffer[sVar2] = *src;
      }
      else {
        src = src + 1;
        this->m_nalBuffer[sVar2] = *pbVar1;
        lVar3 = lVar3 + 1;
      }
      sVar2 = sVar2 + 1;
      lVar3 = lVar3 + 1;
      src = src + 1;
    } while (lVar3 < size);
  }
  this->m_nalBufferLen = sVar2;
  return sVar2;
}

Assistant:

int64_t vc1_unescape_buffer(uint8_t* src, const int64_t size)
    {
        delete[] m_nalBuffer;
        m_nalBuffer = new uint8_t[size];
        if (size < 4)
        {
            std::copy_n(src, size, m_nalBuffer);
            m_nalBufferLen = size;
            return size;
        }
        int64_t dsize = 0;
        for (int64_t i = 0; i < size; i++, src++)
        {
            if (src[0] == 3 && i >= 2 && !src[-1] && !src[-2] && i < size - 1 && src[1] < 4)
            {
                m_nalBuffer[dsize++] = src[1];
                src++;
                i++;
            }
            else
                m_nalBuffer[dsize++] = *src;
        }
        m_nalBufferLen = dsize;
        return dsize;
    }